

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *p,Vec_Int_t *vPivot,int fRemove,int fUpdate)

{
  Vec_Int_t *pVVar1;
  int Lit;
  int iVar2;
  int iVar3;
  Vec_Flt_t *p_00;
  int iVar4;
  int i;
  
  iVar2 = vPivot->nSize;
  iVar4 = 0;
  if (1 < iVar2) {
    iVar4 = 1;
    while (iVar4 < iVar2) {
      Lit = Vec_IntEntry(vPivot,iVar4);
      iVar4 = iVar4 + 1;
      for (i = iVar4; iVar2 = vPivot->nSize, i < iVar2; i = i + 1) {
        iVar2 = Vec_IntEntry(vPivot,i);
        if (iVar2 <= Lit) {
          __assert_fail("Lit < Lit2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                        ,0x2f4,"int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)"
                       );
        }
        pVVar1 = p->vCubeFree;
        pVVar1->nSize = 0;
        iVar3 = Abc_LitNot(Lit);
        iVar3 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(pVVar1,iVar3);
        pVVar1 = p->vCubeFree;
        iVar2 = Abc_LitNot(iVar2);
        iVar2 = Abc_Var2Lit(iVar2,1);
        Vec_IntPush(pVVar1,iVar2);
        iVar3 = Hsh_VecManAdd(p->pHash,p->vCubeFree);
        p_00 = p->vWeights;
        iVar2 = p_00->nSize;
        if (fRemove == 0) {
          if (iVar2 == iVar3) {
            iVar2 = Fx_ManComputeLevelDiv(p,p->vCubeFree);
            Vec_FltPush(p_00,(float)iVar2 * -0.001 + -1.1);
            p->nDivsS = p->nDivsS + 1;
            p_00 = p->vWeights;
            iVar2 = p_00->nSize;
          }
          if (iVar2 <= iVar3) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                          ,0x300,
                          "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
          }
          Vec_FltAddToEntry(p_00,iVar3,1.0);
          iVar2 = 1;
        }
        else {
          if (iVar2 <= iVar3) {
            __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcFx.c"
                          ,0x306,
                          "int Fx_ManCubeSingleCubeDivisors(Fx_Man_t *, Vec_Int_t *, int, int)");
          }
          Vec_FltAddToEntry(p_00,iVar3,-1.0);
          iVar2 = -1;
        }
        p->nPairsS = p->nPairsS + iVar2;
        if (fUpdate != 0) {
          iVar2 = Vec_QueIsMember(p->vPrio,iVar3);
          if (iVar2 == 0) {
            if (fRemove == 0) {
              Vec_QuePush(p->vPrio,iVar3);
            }
          }
          else {
            Vec_QueUpdate(p->vPrio,iVar3);
          }
        }
      }
    }
    iVar4 = ((iVar2 + -1) * iVar2) / 2;
  }
  return iVar4;
}

Assistant:

int Fx_ManCubeSingleCubeDivisors( Fx_Man_t * p, Vec_Int_t * vPivot, int fRemove, int fUpdate )
{
    int k, n, Lit, Lit2, iDiv;
    if ( Vec_IntSize(vPivot) < 2 )
        return 0;
    Vec_IntForEachEntryStart( vPivot, Lit, k, 1 )
    Vec_IntForEachEntryStart( vPivot, Lit2, n, k+1 )
    {
        assert( Lit < Lit2 );
        Vec_IntClear( p->vCubeFree );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit), 0) );
        Vec_IntPush( p->vCubeFree, Abc_Var2Lit(Abc_LitNot(Lit2), 1) );
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( Vec_FltSize(p->vWeights) == iDiv )
            {
                Vec_FltPush(p->vWeights, -2 + 0.9 - 0.001 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
                p->nDivsS++;
            }
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, 1 );
            p->nPairsS++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -1 );
            p->nPairsS--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    }
    return Vec_IntSize(vPivot) * (Vec_IntSize(vPivot) - 1) / 2;
}